

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

int entersweep(lua_State *L)

{
  global_State *pgVar1;
  GCObject **ppGVar2;
  int n;
  int local_1c;
  
  pgVar1 = L->l_G;
  local_1c = 0;
  pgVar1->gcstate = '\x02';
  pgVar1->sweepstrgc = 0;
  ppGVar2 = sweeptolive(L,&pgVar1->finobj,&local_1c);
  pgVar1->sweepfin = ppGVar2;
  ppGVar2 = sweeptolive(L,&pgVar1->allgc,&local_1c);
  pgVar1->sweepgc = ppGVar2;
  return local_1c;
}

Assistant:

static int entersweep (lua_State *L) {
  global_State *g = G(L);
  int n = 0;
  g->gcstate = GCSsweepstring;
  lua_assert(g->sweepgc == NULL && g->sweepfin == NULL);
  /* prepare to sweep strings, finalizable objects, and regular objects */
  g->sweepstrgc = 0;
  g->sweepfin = sweeptolive(L, &g->finobj, &n);
  g->sweepgc = sweeptolive(L, &g->allgc, &n);
  return n;
}